

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg.cpp
# Opt level: O0

bool mg::data::mrg_read(string *hed,string *mrg,Mrg *out)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  char *pcVar4;
  allocator local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  PackedEntryHeader local_48;
  PackedEntryHeader header;
  ssize_t i;
  PackedEntryHeader *raw_entries;
  ssize_t entry_count;
  Mrg *out_local;
  string *mrg_local;
  string *hed_local;
  
  uVar2 = std::__cxx11::string::size();
  if ((uVar2 & 7) == 0) {
    uVar2 = std::__cxx11::string::size();
    lVar3 = std::__cxx11::string::data();
    std::vector<mg::data::Mrg::Entry,_std::allocator<mg::data::Mrg::Entry>_>::clear(&out->entries);
    header.offset = 0;
    header.size_sectors = 0;
    header.size_uncompressed_sectors = 0;
    for (; (long)header < (long)(uVar2 >> 3); header = (PackedEntryHeader)((long)header + 1)) {
      local_48 = *(PackedEntryHeader *)(lVar3 + (long)header * 8);
      Mrg::PackedEntryHeader::to_host_order(&local_48);
      if (local_48.offset == 0xffffffff) break;
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)mrg);
      uVar1 = (ulong)local_48 >> 0x20;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_68,pcVar4,(uVar1 & 0xffff) << 0xb,&local_69);
      std::vector<mg::data::Mrg::Entry,std::allocator<mg::data::Mrg::Entry>>::
      emplace_back<std::__cxx11::string>
                ((vector<mg::data::Mrg::Entry,std::allocator<mg::data::Mrg::Entry>> *)out,&local_68)
      ;
      std::__cxx11::string::~string((string *)&local_68);
      std::allocator<char>::~allocator((allocator<char> *)&local_69);
    }
    hed_local._7_1_ = true;
  }
  else {
    fprintf(_stderr,"Wrong size for HED, must be multiple of %lu\n",8);
    hed_local._7_1_ = false;
  }
  return hed_local._7_1_;
}

Assistant:

bool mrg_read(const std::string &hed, const std::string &mrg, Mrg &out) {
  if (hed.size() % sizeof(Mrg::PackedEntryHeader) != 0) {
    fprintf(stderr, "Wrong size for HED, must be multiple of %lu\n",
            sizeof(Mrg::PackedEntryHeader));
    return false;
  }

  // Reinterpret header
  const ssize_t entry_count = hed.size() / sizeof(Mrg::PackedEntryHeader);
  const Mrg::PackedEntryHeader *raw_entries =
      reinterpret_cast<const Mrg::PackedEntryHeader *>(hed.data());

  // Parse off each entry
  out.entries.clear();
  for (ssize_t i = 0; i < entry_count; i++) {
    // Copy current header
    Mrg::PackedEntryHeader header = raw_entries[i];

    // Endian swap to host
    header.to_host_order();

    // Is this EOF?
    if (header.offset == 0xFFFF'FFFF) {
      break;
    }

    // Excise the source data at the specified offset + len
    out.entries.emplace_back(
        std::string(&mrg[header.offset * Mrg::SECTOR_SIZE],
                    header.size_sectors * Mrg::SECTOR_SIZE));
  }

  return true;
}